

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007920e0 == '\x01') {
    DAT_007920e0 = '\0';
    (*(code *)*_KNearestNeighborsClassifier_default_instance_)();
  }
  if (DAT_00792168 == '\x01') {
    DAT_00792168 = '\0';
    (*(code *)*_NearestNeighborsIndex_default_instance_)();
  }
  if (DAT_007921a0 == '\x01') {
    DAT_007921a0 = '\0';
    (*(code *)*_UniformWeighting_default_instance_)();
  }
  if (DAT_007921c0 == '\x01') {
    DAT_007921c0 = '\0';
    (*(code *)*_InverseDistanceWeighting_default_instance_)();
  }
  if (DAT_007921e0 == '\x01') {
    DAT_007921e0 = '\0';
    (*(code *)*_LinearIndex_default_instance_)();
  }
  if (DAT_00792200 == '\x01') {
    DAT_00792200 = '\0';
    (*(code *)*_SingleKdTreeIndex_default_instance_)();
  }
  if (DAT_00792220 == '\x01') {
    DAT_00792220 = 0;
    (*(code *)*_SquaredEuclideanDistance_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _KNearestNeighborsClassifier_default_instance_.Shutdown();
  _NearestNeighborsIndex_default_instance_.Shutdown();
  _UniformWeighting_default_instance_.Shutdown();
  _InverseDistanceWeighting_default_instance_.Shutdown();
  _LinearIndex_default_instance_.Shutdown();
  _SingleKdTreeIndex_default_instance_.Shutdown();
  _SquaredEuclideanDistance_default_instance_.Shutdown();
}